

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O3

light_pcapng_t * light_pcapng_open_append(char *file_path)

{
  light_pcapng_t *plVar1;
  light_pcapng pcapng;
  light_pcapng p_Var2;
  __fd_t pFVar3;
  
  if (file_path == (char *)0x0) {
    light_pcapng_open_append_cold_2();
  }
  else {
    plVar1 = light_pcapng_open_read(file_path,LIGHT_TRUE);
    if (plVar1 != (light_pcapng_t *)0x0) {
      p_Var2 = plVar1->pcapng;
      if (plVar1->pcapng != (light_pcapng)0x0) {
        do {
          pcapng = p_Var2;
          p_Var2 = light_next_block(pcapng);
        } while (p_Var2 != (light_pcapng)0x0);
        plVar1->pcapng_iter = pcapng;
      }
      pFVar3 = light_open(file_path,LIGHT_OAPPEND);
      plVar1->file = pFVar3;
      return plVar1;
    }
    light_pcapng_open_append_cold_1();
  }
  return (light_pcapng_t *)0x0;
}

Assistant:

light_pcapng_t *light_pcapng_open_append(const char* file_path)
{
	DCHECK_NULLP(file_path, return NULL);

	light_pcapng_t *pcapng = light_pcapng_open_read(file_path, LIGHT_TRUE);
	DCHECK_NULLP(pcapng, return NULL);

	light_pcapng iter = pcapng->pcapng;
	while (iter != NULL)
	{
		pcapng->pcapng_iter = iter;
		iter = light_next_block(iter);
	}

	pcapng->file = light_open(file_path, LIGHT_OAPPEND);

	return pcapng;
}